

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FactoredDecPOMDPDiscrete.cpp
# Opt level: O2

bool FactoredDecPOMDPDiscrete::ConsistentVectorsOnSpecifiedScopes
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *v1,Scope *scope1,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *v2,Scope *scope2)

{
  Index *pIVar1;
  Index IVar2;
  ulong uVar3;
  Index *pIVar4;
  
  pIVar1 = (scope2->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar3 = 0;
  for (pIVar4 = (scope2->super_SDT).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start; pIVar4 != pIVar1; pIVar4 = pIVar4 + 1) {
    IVar2 = Scope::GetPositionForIndex(scope1,*pIVar4);
    if ((v1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[IVar2] !=
        (v2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_start[uVar3]) break;
    uVar3 = (ulong)((int)uVar3 + 1);
  }
  return pIVar4 == pIVar1;
}

Assistant:

bool FactoredDecPOMDPDiscrete::
ConsistentVectorsOnSpecifiedScopes( 
                                        const std::vector<Index>& v1, 
                                        const Scope& scope1,
                                        const std::vector<Index>& v2,
                                        const Scope& scope2)
{
    Scope::const_iterator s2_it = scope2.begin();
    Scope::const_iterator s2_last = scope2.end();
    Index v2_I = 0;
    while(s2_it != s2_last)
    {
        //check that v1 specifies the same value for variable *s2_it
        Index varI = *s2_it;
        Index pos_in_v1 = scope1.GetPositionForIndex(varI);
        if(v1[pos_in_v1] != v2[v2_I] )
            return false;

        s2_it++;
        v2_I++;
    }
    return true;

}